

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O0

void __thiscall QTextTable::insertRows(QTextTable *this,int pos,int num)

{
  uint uVar1;
  Operation op;
  QTextTablePrivate *pQVar2;
  QTextFormatCollection *this_00;
  uint *puVar3;
  FragmentMap *pFVar4;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int bfmt;
  int cfmt;
  int pos_1;
  int cell;
  int i;
  int lastCell;
  int insert_before;
  int extended;
  QTextFormatCollection *c;
  QTextDocumentPrivate *p;
  QTextTablePrivate *d;
  QTextCharFormat fmt_1;
  FragmentIterator it_1;
  QTextCharFormat fmt;
  FragmentIterator it;
  QTextDocumentPrivate *in_stack_ffffffffffffff20;
  QTextDocumentPrivate *this_01;
  QTextCharFormat *in_stack_ffffffffffffff28;
  QTextFormatCollection *in_stack_ffffffffffffff30;
  QTextFormatCollection *in_stack_ffffffffffffff40;
  QTextDocumentPrivate *in_stack_ffffffffffffff48;
  int local_ac;
  FormatChangeMode in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint node;
  int iVar5;
  QTextTablePrivate *in_stack_ffffffffffffff80;
  QTextDocumentPrivate *pQVar6;
  int local_6c;
  QChar local_5a [9];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 local_38 [16];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QTextTable *)0x897169);
  if (0 < in_EDX) {
    if ((pQVar2->dirty & 1U) != 0) {
      QTextTablePrivate::update(in_stack_ffffffffffffff80);
    }
    if ((pQVar2->nRows < in_ESI) || (local_6c = in_ESI, in_ESI < 0)) {
      local_6c = pQVar2->nRows;
    }
    this_01 = (pQVar2->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
    this_00 = QTextDocumentPrivate::formatCollection(this_01);
    QTextDocumentPrivate::beginEditBlock(this_01);
    iVar5 = 0;
    node = 0;
    if ((local_6c < 1) || (pQVar2->nRows <= local_6c)) {
      if (local_6c == 0) {
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
                                    (size_type)in_stack_ffffffffffffff28);
        node = *puVar3;
      }
      else {
        node = (pQVar2->super_QTextFramePrivate).fragment_end;
      }
    }
    else {
      in_stack_ffffffffffffff6c = 0xffffffff;
      for (in_stack_ffffffffffffff68 = 0; in_stack_ffffffffffffff68 < pQVar2->nCols;
          in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 + 1) {
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
                                    (size_type)in_stack_ffffffffffffff28);
        uVar1 = *puVar3;
        in_stack_ffffffffffffff64 = uVar1;
        puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
                                    (size_type)in_stack_ffffffffffffff28);
        if (uVar1 == *puVar3) {
          if (in_stack_ffffffffffffff64 != in_stack_ffffffffffffff6c) {
            local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            pFVar4 = QTextDocumentPrivate::fragmentMap(this_01);
            QFragmentMap<QTextFragmentData>::ConstIterator::ConstIterator
                      ((ConstIterator *)local_18,pFVar4,in_stack_ffffffffffffff64);
            local_28 = &DAT_aaaaaaaaaaaaaaaa;
            local_20 = &DAT_aaaaaaaaaaaaaaaa;
            in_stack_ffffffffffffff40 = this_00;
            QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x897324);
            QTextFormatCollection::charFormat
                      (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
            QTextCharFormat::tableCellRowSpan((QTextCharFormat *)in_stack_ffffffffffffff20);
            in_stack_ffffffffffffff48 = this_01;
            QTextCharFormat::setTableCellRowSpan
                      (in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
            this_01 = in_stack_ffffffffffffff48;
            QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)0x897370);
            QTextDocumentPrivate::setCharFormat
                      ((QTextDocumentPrivate *)CONCAT44(iVar5,node),in_stack_ffffffffffffff6c,
                       in_stack_ffffffffffffff68,
                       (QTextCharFormat *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff5c);
            QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x89739a);
          }
          iVar5 = iVar5 + 1;
        }
        else if (node == 0) {
          node = in_stack_ffffffffffffff64;
        }
        in_stack_ffffffffffffff6c = in_stack_ffffffffffffff64;
      }
    }
    if (iVar5 < pQVar2->nCols) {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pFVar4 = QTextDocumentPrivate::fragmentMap(this_01);
      QFragmentMap<QTextFragmentData>::ConstIterator::ConstIterator
                ((ConstIterator *)local_38,pFVar4,node);
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x897493);
      QTextFormatCollection::charFormat(in_stack_ffffffffffffff30,(int)((ulong)this_00 >> 0x20));
      QTextCharFormat::setTableCellRowSpan
                ((QTextCharFormat *)this_00,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      QTextCharFormat::setTableCellColumnSpan
                ((QTextCharFormat *)this_00,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      op = QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)0x8974d9);
      QTextDocumentPrivate::formatCollection(this_01);
      QTextFormatCollection::indexForFormat
                ((QTextFormatCollection *)in_stack_ffffffffffffff48,
                 (QTextFormat *)in_stack_ffffffffffffff40);
      QTextDocumentPrivate::formatCollection(this_01);
      QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)0x897517);
      QTextFormatCollection::indexForFormat
                ((QTextFormatCollection *)in_stack_ffffffffffffff48,
                 (QTextFormat *)in_stack_ffffffffffffff40);
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x89753a);
      for (local_ac = 0; local_ac < in_EDX * (pQVar2->nCols - iVar5); local_ac = local_ac + 1) {
        pQVar6 = this_01;
        QChar::QChar<char16_t,_true>(local_5a,L'﷐');
        QTextDocumentPrivate::insertBlock
                  ((QTextDocumentPrivate *)CONCAT44(iVar5,node),
                   (QChar)(char16_t)((ulong)in_RDI >> 0x30),in_stack_ffffffffffffff6c,
                   in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,op);
        in_stack_ffffffffffffff20 = this_01;
        this_01 = pQVar6;
      }
      QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x8975c3);
    }
    QTextDocumentPrivate::endEditBlock(in_stack_ffffffffffffff20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextTable::insertRows(int pos, int num)
{
    Q_D(QTextTable);
    if (num <= 0)
        return;

    if (d->dirty)
        d->update();

    if (pos > d->nRows || pos < 0)
        pos = d->nRows;

//     qDebug() << "-------- insertRows" << pos << num;
    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *c = p->formatCollection();
    p->beginEditBlock();

    int extended = 0;
    int insert_before = 0;
    if (pos > 0 && pos < d->nRows) {
        int lastCell = -1;
        for (int i = 0; i < d->nCols; ++i) {
            int cell = d->grid[pos*d->nCols + i];
            if (cell == d->grid[(pos-1)*d->nCols+i]) {
                // cell spans the insertion place, extend it
                if (cell != lastCell) {
                    QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
                    QTextCharFormat fmt = c->charFormat(it->format);
                    fmt.setTableCellRowSpan(fmt.tableCellRowSpan() + num);
                    p->setCharFormat(it.position(), 1, fmt);
                }
                extended++;
            } else if (!insert_before) {
                insert_before = cell;
            }
            lastCell = cell;
        }
    } else {
        insert_before = (pos == 0 ? d->grid[0] : d->fragment_end);
    }
    if (extended < d->nCols) {
        Q_ASSERT(insert_before);
        QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), insert_before);
        QTextCharFormat fmt = c->charFormat(it->format);
        fmt.setTableCellRowSpan(1);
        fmt.setTableCellColumnSpan(1);
        Q_ASSERT(fmt.objectIndex() == objectIndex());
        int pos = it.position();
        int cfmt = p->formatCollection()->indexForFormat(fmt);
        int bfmt = p->formatCollection()->indexForFormat(QTextBlockFormat());
//         qDebug("inserting %d cells, nCols=%d extended=%d", num*(d->nCols-extended), d->nCols, extended);
        for (int i = 0; i < num*(d->nCols-extended); ++i)
            p->insertBlock(QTextBeginningOfFrame, pos, bfmt, cfmt, QTextUndoCommand::MoveCursor);
    }

//     qDebug() << "-------- end insertRows" << pos << num;
    p->endEditBlock();
}